

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage
          (FileGenerator *this,int idx,Printer *p)

{
  undefined1 *puVar1;
  Printer *pPVar2;
  bool bVar3;
  Options *in_RCX;
  Options *options;
  char *pcVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  CrossFileReferences refs;
  NamespaceOpener proto_ns;
  NamespaceOpener ns;
  Printer *apPStack_280 [2];
  undefined8 local_270;
  undefined1 *local_268;
  undefined1 local_260 [24];
  char *local_248;
  size_t local_240;
  char local_238;
  undefined7 uStack_237;
  MaybeInitializedPtr MStack_230;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
  local_228;
  Printer *local_218;
  CrossFileReferences local_210;
  undefined1 local_1c8 [32];
  pointer local_1a8;
  undefined8 local_1a0;
  code *local_198;
  code *local_190;
  undefined1 local_188;
  undefined1 *local_180;
  undefined8 local_178;
  undefined1 local_170 [16];
  undefined1 local_160;
  undefined1 local_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100 [8];
  undefined8 uStack_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  code *local_e0;
  code *local_d8;
  undefined1 local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8;
  undefined1 local_60;
  NamespaceOpener local_58;
  
  apPStack_280[0] = (Printer *)0x1beaec;
  apPStack_280[1] = p;
  local_270._0_4_ = idx;
  (anonymous_namespace)::FileVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1c8,(_anonymous_namespace_ *)this->file_,(FileDescriptor *)&this->options_,
             in_RCX);
  apPStack_280[0] = (Printer *)0x1beafc;
  io::Printer::
  WithVars<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>,void,void>
            (&local_228,p,
             (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1c8);
  apPStack_280[0] = (Printer *)0x1beb09;
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1c8);
  apPStack_280[0] = (Printer *)0x1beb15;
  GenerateSourceIncludes(this,apPStack_280[1]);
  apPStack_280[0] = (Printer *)0x1beb2e;
  google::protobuf::io::Printer::Emit
            (apPStack_280[1],0,0,0xa9,
             "\n    PROTOBUF_PRAGMA_INIT_SEG\n    namespace _pb = ::$proto_ns$;\n    namespace _pbi = ::$proto_ns$::internal;\n    namespace _fl = ::$proto_ns$::internal::field_layout;\n  "
            );
  apPStack_280[0] = (Printer *)0x1beb37;
  bVar3 = IsAnyMessage(this->file_);
  if (bVar3) {
    apPStack_280[0] = (Printer *)0x1beb54;
    google::protobuf::io::Printer::Emit
              (apPStack_280[1],0,0,0x8e,
               "\n    #if defined(__llvm__)\n    #pragma clang diagnostic push\n    #pragma clang diagnostic ignored \"-Wuninitialized\"\n    #endif  // __llvm__\n  "
              );
  }
  local_210.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  local_210.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_210.weak_default_instances.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  local_210.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  local_210.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_210.strong_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  local_210.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  local_210.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_210.weak_reflection_files.
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  options = (Options *)
            (this->message_generators_).
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = *(long *)(&options->access_info_map)[(int)local_270];
  if (0 < *(int *)(lVar8 + 0x8c)) {
    lVar7 = 0;
    lVar5 = 0;
    do {
      apPStack_280[0] = (Printer *)0x1bebde;
      GetCrossFileReferencesForField
                (this,(FieldDescriptor *)(*(long *)(lVar8 + 0x60) + lVar7),&local_210);
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x58;
    } while (lVar5 < *(int *)(lVar8 + 0x8c));
  }
  if (0 < *(int *)(lVar8 + 4)) {
    lVar7 = 0;
    lVar5 = 0;
    do {
      apPStack_280[0] = (Printer *)0x1bec17;
      GetCrossFileReferencesForField
                (this,(FieldDescriptor *)(*(long *)(lVar8 + 0x38) + lVar7),&local_210);
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x58;
    } while (lVar5 < *(int *)(lVar8 + 4));
  }
  apPStack_280[0] = (Printer *)0x1bec39;
  GenerateInternalForwardDeclarations(this,&local_210,apPStack_280[1]);
  apPStack_280[0] = (Printer *)0x1bec50;
  Namespace_abi_cxx11_
            ((string *)local_1c8,(cpp *)this->file_,(FileDescriptor *)&this->options_,options);
  apPStack_280[0] = (Printer *)0x1bec71;
  NamespaceOpener::NamespaceOpener(&local_58,local_1c8._8_8_,local_1c8._0_8_,apPStack_280[1]);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    apPStack_280[0] = (Printer *)0x1bec92;
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  pPVar2 = apPStack_280[1];
  apPStack_280[0] = (Printer *)0x1becb7;
  local_248 = &local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"defaults","");
  if (local_248 == &local_238) {
    local_1c8._24_8_ = MStack_230;
    local_1c8._0_8_ = local_1c8 + 0x10;
  }
  else {
    local_1c8._0_8_ = local_248;
  }
  local_218 = pPVar2;
  local_1c8._8_8_ = local_240;
  local_240 = 0;
  local_238 = '\0';
  apPStack_280[0] = (Printer *)0x1bed1a;
  local_248 = &local_238;
  local_1a8 = (pointer)operator_new(0x20);
  (local_1a8->_M_dataplus)._M_p = (pointer)this;
  local_1a8->_M_string_length = (size_type)&local_270;
  (local_1a8->field_2)._M_allocated_capacity = (size_type)(apPStack_280 + 1);
  (local_1a8->field_2)._M_local_buf[8] = '\0';
  local_190 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_1a0 = 0;
  local_198 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_188 = 1;
  local_180 = local_170;
  local_178 = 0;
  local_170[0] = 0;
  local_160 = 0;
  apPStack_280[0] = (Printer *)0x1bed96;
  std::__cxx11::string::_M_replace((ulong)&local_180,0,(char *)0x0,0x361ff2);
  local_118 = 0;
  puVar1 = local_260 + 8;
  apPStack_280[0] = (Printer *)0x1bedc4;
  local_268 = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"class_methods","");
  local_110 = local_100;
  if (local_268 == puVar1) {
    uStack_f8 = local_260._16_8_;
  }
  else {
    local_110 = local_268;
  }
  local_108 = local_260._0_8_;
  local_260._0_8_ = 0;
  local_260[8] = 0;
  apPStack_280[0] = (Printer *)0x1bee26;
  local_268 = puVar1;
  local_f0 = (undefined8 *)operator_new(0x20);
  *local_f0 = this;
  local_f0[1] = &local_270;
  local_f0[2] = apPStack_280 + 1;
  *(undefined1 *)(local_f0 + 3) = 0;
  local_d8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_e8 = 0;
  local_e0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_d0 = 1;
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = 0;
  local_a8 = 0;
  apPStack_280[0] = (Printer *)0x1bee9f;
  std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,0x361ff2);
  local_60 = 0;
  apPStack_280[0] = (Printer *)0x1beec9;
  google::protobuf::io::Printer::Emit
            (local_218,local_1c8,2,0x73,
             "\n          $defaults$;\n\n          $class_methods$;\n\n          // @@protoc_insertion_point(namespace_scope)\n        "
            );
  lVar8 = 0x170;
  do {
    if (local_1c8[lVar8 + -8] == '\x01') {
      apPStack_280[0] = (Printer *)0x1bef03;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 ((long)&local_210.weak_default_instances.
                         super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                         .
                         super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                         .tree_.root_ + lVar8));
    }
    pcVar4 = local_228.storage_.callback_buffer_ + lVar8 + -8;
    if ((long *)pcVar4 != *(long **)(&local_238 + lVar8)) {
      apPStack_280[0] = (Printer *)0x1bef1f;
      operator_delete(*(long **)(&local_238 + lVar8),*(long *)pcVar4 + 1);
    }
    apPStack_280[0] = (Printer *)0x1bef32;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)&local_240 + lVar8)]._M_data)
              ((anon_class_1_0_00000001 *)((long)&local_270 + 7),
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_260 + lVar8));
    *(undefined1 *)((long)&local_240 + lVar8) = 0xff;
    if ((long *)((long)&local_270 + lVar8) != *(long **)((long)apPStack_280 + lVar8)) {
      apPStack_280[0] = (Printer *)0x1bef52;
      operator_delete(*(long **)((long)apPStack_280 + lVar8),*(long *)((long)&local_270 + lVar8) + 1
                     );
    }
    lVar8 = lVar8 + -0xb8;
  } while (lVar8 != 0);
  if (local_268 != local_260 + 8) {
    apPStack_280[0] = (Printer *)0x1bef77;
    operator_delete(local_268,CONCAT71(local_260._9_7_,local_260[8]) + 1);
  }
  if (local_248 != &local_238) {
    apPStack_280[0] = (Printer *)0x1bef93;
    operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
  }
  apPStack_280[0] = (Printer *)0x1befa0;
  NamespaceOpener::~NamespaceOpener(&local_58);
  bVar3 = (this->options_).opensource_runtime != false;
  uVar6 = 6;
  if (bVar3) {
    uVar6 = 0x10;
  }
  pcVar4 = "proto2";
  if (bVar3) {
    pcVar4 = "google::protobuf";
  }
  apPStack_280[0] = (Printer *)0x1befd8;
  NamespaceOpener::NamespaceOpener((NamespaceOpener *)local_1c8,uVar6,pcVar4,apPStack_280[1]);
  apPStack_280[0] = (Printer *)0x1beff1;
  MessageGenerator::GenerateSourceInProto2Namespace
            ((MessageGenerator *)
             (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(int)local_270]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ._M_t,apPStack_280[1]);
  apPStack_280[0] = (Printer *)0x1beffe;
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_1c8);
  apPStack_280[0] = (Printer *)0x1bf007;
  bVar3 = IsAnyMessage(this->file_);
  if (bVar3) {
    apPStack_280[0] = (Printer *)0x1bf024;
    google::protobuf::io::Printer::Emit
              (apPStack_280[1],0,0,0x56,
               "\n    #if defined(__llvm__)\n    #pragma clang diagnostic pop\n    #endif  // __llvm__\n  "
              );
  }
  apPStack_280[0] = (Printer *)0x1bf03d;
  google::protobuf::io::Printer::Emit
            (apPStack_280[1],0,0,0x31,"\n    // @@protoc_insertion_point(global_scope)\n  ");
  apPStack_280[0] = (Printer *)0x1bf045;
  absl::lts_20240722::container_internal::
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  ::~btree((btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
            *)&local_210.weak_reflection_files);
  apPStack_280[0] = (Printer *)0x1bf04d;
  absl::lts_20240722::container_internal::
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  ::~btree((btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
            *)&local_210.strong_reflection_files);
  apPStack_280[0] = (Printer *)0x1bf057;
  absl::lts_20240722::container_internal::
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  ::~btree((btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
            *)&local_210);
  if (local_228.storage_.is_callback_engaged_ == true) {
    apPStack_280[0] = (Printer *)0x1bf06d;
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::pop_back((vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                *)((long)local_228.storage_.callback_buffer_ + 0x98));
  }
  return;
}

Assistant:

void FileGenerator::GenerateSourceForMessage(int idx, io::Printer* p) {
  auto v = p->WithVars(FileVars(file_, options_));

  GenerateSourceIncludes(p);
  GenerateSourcePrelude(p);

  if (IsAnyMessage(file_)) {
    MuteWuninitialized(p);
  }

  CrossFileReferences refs;
  ForEachField<false>(message_generators_[idx]->descriptor(),
                      [this, &refs](const FieldDescriptor* field) {
                        GetCrossFileReferencesForField(field, &refs);
                      });

  GenerateInternalForwardDeclarations(refs, p);

  {
    NamespaceOpener ns(Namespace(file_, options_), p);
    p->Emit(
        {
            {"defaults", [&] { GenerateSourceDefaultInstance(idx, p); }},
            {"class_methods",
             [&] { message_generators_[idx]->GenerateClassMethods(p); }},
        },
        R"cc(
          $defaults$;

          $class_methods$;

          // @@protoc_insertion_point(namespace_scope)
        )cc");
  }

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), p);
    message_generators_[idx]->GenerateSourceInProto2Namespace(p);
  }

  if (IsAnyMessage(file_)) {
    UnmuteWuninitialized(p);
  }

  p->Emit(R"cc(
    // @@protoc_insertion_point(global_scope)
  )cc");
}